

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_growpc(BuildCtx *ctx,uint maxpc)

{
  dasm_State *pdVar1;
  size_t sVar2;
  int *piVar3;
  size_t _need;
  size_t _sz;
  size_t osz;
  dasm_State *D;
  uint maxpc_local;
  BuildCtx *ctx_local;
  
  pdVar1 = ctx->D;
  sVar2 = pdVar1->pcsize;
  _need = pdVar1->pcsize;
  if (_need < (ulong)maxpc << 2) {
    if (_need < 0x10) {
      _need = 0x10;
    }
    for (; _need < (ulong)maxpc << 2; _need = _need * 2) {
    }
    piVar3 = (int *)realloc(pdVar1->pclabels,_need);
    pdVar1->pclabels = piVar3;
    if (pdVar1->pclabels == (int *)0x0) {
      exit(1);
    }
    pdVar1->pcsize = _need;
  }
  memset((void *)((long)pdVar1->pclabels + sVar2),0,pdVar1->pcsize - sVar2);
  return;
}

Assistant:

void dasm_growpc(Dst_DECL, unsigned int maxpc)
{
  dasm_State *D = Dst_REF;
  size_t osz = D->pcsize;
  DASM_M_GROW(Dst, int, D->pclabels, D->pcsize, maxpc*sizeof(int));
  memset((void *)(((unsigned char *)D->pclabels)+osz), 0, D->pcsize-osz);
}